

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void parse_blend_design_positions(T1_Face face,T1_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  FT_Fixed FVar3;
  T1_Token token2;
  FT_Int n_axis;
  FT_Int axis;
  T1_Token token;
  T1_TokenRec axis_tokens [4];
  int local_1cc;
  FT_Int n;
  FT_Byte *old_limit;
  FT_Byte *old_cursor;
  PS_Blend blend;
  FT_Error error;
  T1_Parser parser;
  FT_Int num_axis;
  FT_Int num_designs;
  T1_TokenRec design_tokens [16];
  T1_Loader loader_local;
  T1_Face face_local;
  
  blend._4_4_ = 0;
  design_tokens[0xf]._16_8_ = loader;
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,(T1_Token)&num_axis,0x10,(FT_Int *)((long)&parser + 4));
  if ((int)parser._4_4_ < 0) {
    blend._4_4_ = 0xa2;
  }
  else if ((parser._4_4_ == 0) || (0x10 < (int)parser._4_4_)) {
    blend._4_4_ = 3;
  }
  else {
    pFVar1 = (loader->parser).root.cursor;
    pFVar2 = (loader->parser).root.limit;
    old_cursor = (FT_Byte *)face->blend;
    parser._0_4_ = 0;
    for (local_1cc = 0; local_1cc < (int)parser._4_4_; local_1cc = local_1cc + 1) {
      _n_axis = &num_axis + (long)local_1cc * 6;
      (loader->parser).root.cursor = *(FT_Byte **)_n_axis;
      (loader->parser).root.limit = design_tokens[local_1cc].start;
      (*(loader->parser).root.funcs.to_token_array)
                ((PS_Parser)loader,(T1_Token)&token,4,(FT_Int *)&token2);
      if (local_1cc == 0) {
        if (((int)(FT_UInt)token2 < 1) || (4 < (int)(FT_UInt)token2)) {
          blend._4_4_ = 3;
          goto LAB_0035098e;
        }
        parser._0_4_ = (FT_UInt)token2;
        blend._4_4_ = t1_allocate_blend(face,parser._4_4_,(FT_UInt)token2);
        if (blend._4_4_ != 0) goto LAB_0035098e;
        old_cursor = (FT_Byte *)face->blend;
      }
      else if ((FT_UInt)token2 != (FT_UInt)parser) {
        blend._4_4_ = 3;
        goto LAB_0035098e;
      }
      for (token2._4_4_ = 0; token2._4_4_ < (int)(FT_UInt)token2; token2._4_4_ = token2._4_4_ + 1) {
        (loader->parser).root.cursor = *(FT_Byte **)&axis_tokens[(long)token2._4_4_ + -1].type;
        (loader->parser).root.limit = axis_tokens[token2._4_4_].start;
        FVar3 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
        *(FT_Fixed *)(*(long *)(old_cursor + (long)local_1cc * 8 + 0x28) + (long)token2._4_4_ * 8) =
             FVar3;
      }
    }
    *(FT_Byte **)design_tokens[0xf]._16_8_ = pFVar1;
    *(FT_Byte **)(design_tokens[0xf]._16_8_ + 0x10) = pFVar2;
  }
LAB_0035098e:
  *(FT_Error *)(design_tokens[0xf]._16_8_ + 0x18) = blend._4_4_;
  return;
}

Assistant:

static void
  parse_blend_design_positions( T1_Face    face,
                                T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Int       num_axis;
    T1_Parser    parser = &loader->parser;

    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;


    /* get the array of design tokens -- compute number of designs */
    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_blend_design_positions:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    {
      FT_Byte*  old_cursor = parser->root.cursor;
      FT_Byte*  old_limit  = parser->root.limit;
      FT_Int    n;


      blend    = face->blend;
      num_axis = 0;  /* make compiler happy */

      for ( n = 0; n < num_designs; n++ )
      {
        T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
        T1_Token     token;
        FT_Int       axis, n_axis;


        /* read axis/coordinates tokens */
        token = design_tokens + n;
        parser->root.cursor = token->start;
        parser->root.limit  = token->limit;
        T1_ToTokenArray( parser, axis_tokens, T1_MAX_MM_AXIS, &n_axis );

        if ( n == 0 )
        {
          if ( n_axis <= 0 || n_axis > T1_MAX_MM_AXIS )
          {
            FT_ERROR(( "parse_blend_design_positions:"
                       " invalid number of axes: %d\n",
                       n_axis ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          num_axis = n_axis;
          error = t1_allocate_blend( face,
                                     (FT_UInt)num_designs,
                                     (FT_UInt)num_axis );
          if ( error )
            goto Exit;
          blend = face->blend;
        }
        else if ( n_axis != num_axis )
        {
          FT_ERROR(( "parse_blend_design_positions: incorrect table\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* now read each axis token into the design position */
        for ( axis = 0; axis < n_axis; axis++ )
        {
          T1_Token  token2 = axis_tokens + axis;


          parser->root.cursor = token2->start;
          parser->root.limit  = token2->limit;
          blend->design_pos[n][axis] = T1_ToFixed( parser, 0 );
        }
      }

      loader->parser.root.cursor = old_cursor;
      loader->parser.root.limit  = old_limit;
    }

  Exit:
    loader->parser.root.error = error;
  }